

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O0

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,WriteToEndpoint *w)

{
  bool bVar1;
  uint uVar2;
  Expression *pEVar3;
  ArrayElementRef *pAVar4;
  OutputEndpointRef *pOVar5;
  EndpointDeclaration *pEVar6;
  EndpointDetails *pEVar7;
  CompileMessage local_f0;
  vector<soul::Type,_std::allocator<soul::Type>_> local_b8;
  ArrayView<soul::Type> local_a0;
  pool_ptr<soul::AST::Expression> local_90;
  pool_ptr<soul::AST::OutputEndpointRef> local_88;
  pool_ptr<soul::AST::OutputEndpointRef> outputEndpoint_1;
  pool_ptr<soul::AST::ArrayElementRef> local_78;
  pool_ptr<soul::AST::ArrayElementRef> arraySubscript;
  vector<soul::Type,_std::allocator<soul::Type>_> local_68;
  ArrayView<soul::Type> local_50 [2];
  pool_ref<soul::AST::Expression> local_30;
  pool_ptr<soul::AST::OutputEndpointRef> local_28;
  pool_ptr<soul::AST::OutputEndpointRef> outputEndpoint;
  WriteToEndpoint *topLevelWrite;
  WriteToEndpoint *w_local;
  PostResolutionChecks *this_local;
  
  ASTVisitor::visit(&this->super_ASTVisitor,w);
  pEVar3 = pool_ref::operator_cast_to_Expression_((pool_ref *)&w->value);
  throwErrorIfNotReadableValue(pEVar3);
  outputEndpoint.object = (OutputEndpointRef *)ASTUtilities::getTopLevelWriteToEndpoint(w);
  local_30.object = (((WriteToEndpoint *)outputEndpoint.object)->target).object;
  cast<soul::AST::OutputEndpointRef,soul::AST::Expression>((soul *)&local_28,&local_30);
  pool_ref<soul::AST::Expression>::~pool_ref(&local_30);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_28);
  if (bVar1) {
    pOVar5 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&local_28);
    uVar2 = (*(pOVar5->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])();
    if ((uVar2 & 1) != 0) {
      pOVar5 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&local_28);
      pEVar6 = pool_ref<soul::AST::EndpointDeclaration>::operator->(&pOVar5->output);
      pEVar7 = AST::EndpointDeclaration::getDetails(pEVar6);
      AST::EndpointDetails::getSampleArrayTypes(&local_68,pEVar7);
      ArrayView<soul::Type>::ArrayView<std::vector<soul::Type,std::allocator<soul::Type>>>
                (local_50,&local_68);
      pEVar3 = pool_ref::operator_cast_to_Expression_((pool_ref *)&w->value);
      expectSilentCastPossible
                (&(w->super_Expression).super_Statement.super_ASTObject.context,local_50[0],pEVar3);
      std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_68);
    }
    arraySubscript.object._4_4_ = 1;
  }
  else {
    arraySubscript.object._4_4_ = 0;
  }
  pool_ptr<soul::AST::OutputEndpointRef>::~pool_ptr(&local_28);
  if (arraySubscript.object._4_4_ != 0) {
    return;
  }
  outputEndpoint_1.object = (OutputEndpointRef *)((outputEndpoint.object)->output).object;
  cast<soul::AST::ArrayElementRef,soul::AST::Expression>
            ((soul *)&local_78,(pool_ref<soul::AST::Expression> *)&outputEndpoint_1);
  pool_ref<soul::AST::Expression>::~pool_ref((pool_ref<soul::AST::Expression> *)&outputEndpoint_1);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_78);
  if (bVar1) {
    pAVar4 = pool_ptr<soul::AST::ArrayElementRef>::operator->(&local_78);
    local_90.object = (pAVar4->object).object;
    cast<soul::AST::OutputEndpointRef,soul::AST::Expression>((soul *)&local_88,&local_90);
    pool_ptr<soul::AST::Expression>::~pool_ptr(&local_90);
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_88);
    if (bVar1) {
      pOVar5 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&local_88);
      uVar2 = (*(pOVar5->super_Expression).super_Statement.super_ASTObject._vptr_ASTObject[3])();
      if ((uVar2 & 1) != 0) {
        pOVar5 = pool_ptr<soul::AST::OutputEndpointRef>::operator->(&local_88);
        pEVar6 = pool_ref<soul::AST::EndpointDeclaration>::operator->(&pOVar5->output);
        pEVar7 = AST::EndpointDeclaration::getDetails(pEVar6);
        AST::EndpointDetails::getResolvedDataTypes(&local_b8,pEVar7);
        ArrayView<soul::Type>::ArrayView<std::vector<soul::Type,std::allocator<soul::Type>>>
                  (&local_a0,&local_b8);
        pEVar3 = pool_ref::operator_cast_to_Expression_((pool_ref *)&w->value);
        expectSilentCastPossible
                  (&(w->super_Expression).super_Statement.super_ASTObject.context,local_a0,pEVar3);
        std::vector<soul::Type,_std::allocator<soul::Type>_>::~vector(&local_b8);
      }
      arraySubscript.object._4_4_ = 1;
    }
    else {
      arraySubscript.object._4_4_ = 0;
    }
    pool_ptr<soul::AST::OutputEndpointRef>::~pool_ptr(&local_88);
    if (arraySubscript.object._4_4_ != 0) goto LAB_003d5652;
  }
  arraySubscript.object._4_4_ = 0;
LAB_003d5652:
  pool_ptr<soul::AST::ArrayElementRef>::~pool_ptr(&local_78);
  if (arraySubscript.object._4_4_ != 0) {
    return;
  }
  Errors::targetMustBeOutput<>();
  AST::Context::throwError
            (&(w->super_Expression).super_Statement.super_ASTObject.context,&local_f0,false);
}

Assistant:

void visit (AST::WriteToEndpoint& w) override
        {
            super::visit (w);

            throwErrorIfNotReadableValue (w.value);
            auto& topLevelWrite = ASTUtilities::getTopLevelWriteToEndpoint (w);

            // Either an OutputEndpointRef, or an ArrayElementRef of an OutputEndpointRef
            if (auto outputEndpoint = cast<AST::OutputEndpointRef> (topLevelWrite.target))
            {
                if (outputEndpoint->isResolved())
                    expectSilentCastPossible (w.context, outputEndpoint->output->getDetails().getSampleArrayTypes(), w.value);

                return;
            }

            if (auto arraySubscript = cast<AST::ArrayElementRef> (topLevelWrite.target))
            {
                if (auto outputEndpoint = cast<AST::OutputEndpointRef> (arraySubscript->object))
                {
                    if (outputEndpoint->isResolved())
                        expectSilentCastPossible (w.context, outputEndpoint->output->getDetails().getResolvedDataTypes(), w.value);

                    return;
                }
            }

            w.context.throwError (Errors::targetMustBeOutput());
            return;
        }